

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O1

pair<const_pstore::index::details::index_pointer,_unsigned_long> __thiscall
pstore::index::details::linear_node::
lookup<pstore::uint128,pstore::uint128,std::equal_to<pstore::uint128>,void>
          (linear_node *this,pointer db,long *key)

{
  uint64_t uVar1;
  span<unsigned_char,__1L> sp;
  index_pointer iVar2;
  unsigned_long uVar3;
  long lVar4;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar5;
  type uninit_buffer;
  uint128 local_58;
  extent_type<_1L> in_stack_ffffffffffffffb8;
  
  uVar1 = this->size_;
  uVar3 = 0xffffffffffffffff;
  if (uVar1 == 0) {
    iVar2.internal_ = (internal_node *)0x0;
  }
  else {
    lVar4 = 0;
    uVar3 = 0;
    do {
      sp.storage_.data_ = db;
      sp.storage_.super_extent_type<_1L>.size_ = in_stack_ffffffffffffffb8.size_;
      serialize::flood<_1l>(sp);
      serialize::archive::database_reader::get<pstore::uint128,void>
                ((database_reader *)&stack0xffffffffffffffc0,&local_58);
      if (*key == (long)local_58.v_ && key[1] == local_58.v_._8_8_) {
        iVar2 = (index_pointer)((index_pointer *)((long)&this->leaves_[0].a_ + lVar4))->internal_;
        goto LAB_0011ab94;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 8;
    } while (uVar1 << 3 != lVar4);
    iVar2.internal_ = (internal_node *)0x0;
    uVar3 = 0xffffffffffffffff;
  }
LAB_0011ab94:
  pVar5.second = uVar3;
  pVar5.first.internal_ = iVar2.internal_;
  return pVar5;
}

Assistant:

auto linear_node::lookup (database const & db, OtherKeyType const & key,
                                      KeyEqual equal) const
                -> std::pair<index_pointer const, std::size_t> {
                // Linear search. TODO: perhaps we should sort the nodes and use a binary
                // search? This would require a template compare method.
                std::size_t cnum = 0;
                for (auto const & child : *this) {
                    KeyType const existing_key =
                        serialize::read<KeyType> (serialize::archive::database_reader{db, child});
                    if (equal (existing_key, key)) {
                        return {index_pointer{child}, cnum};
                    }
                    ++cnum;
                }
                // Not found
                return {index_pointer (), details::not_found};
            }